

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O2

CompressionRecord Imf_3_4::anon_unknown_1::retrieveCompressionRecord(Header *hdr)

{
  pthread_mutex_t *__mutex;
  iterator iVar1;
  lock_guard<std::mutex> lk;
  CompressionRecord retval;
  CompressionRecord local_20;
  Header *local_18;
  
  CompressionRecord::CompressionRecord(&local_20);
  __mutex = (pthread_mutex_t *)getStash();
  if (__mutex != (pthread_mutex_t *)0x0) {
    std::mutex::lock((mutex *)&__mutex->__data);
    local_18 = hdr;
    iVar1 = std::
            map<const_void_*,_Imf_3_4::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_4::(anonymous_namespace)::CompressionRecord>_>_>
            ::find((map<const_void_*,_Imf_3_4::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_4::(anonymous_namespace)::CompressionRecord>_>_>
                    *)&__mutex[1].__data,&local_18);
    if (iVar1._M_node != (_Base_ptr)((long)__mutex + 0x30)) {
      local_20 = (CompressionRecord)iVar1._M_node[1]._M_parent;
    }
    pthread_mutex_unlock(__mutex);
  }
  return local_20;
}

Assistant:

static CompressionRecord
retrieveCompressionRecord (const Header* hdr)
{
    CompressionRecord retval;

    CompressionStash* s = getStash ();
    if (s)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lk (s->_mutex);
#endif
        auto i = s->_store.find (hdr);
        if (i != s->_store.end ()) retval = i->second;
    }
    return retval;
}